

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
 __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<libaom_test::TestMode,_libaom_test::TestMode>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>
  *in_RSI;
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  *in_RDI;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  PVar1;
  tuple<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<libaom_test::TestMode,_libaom_test::TestMode>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int>_>
  *in_stack_ffffffffffffff58;
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  *g;
  
  g = in_RDI;
  operator_new(0x68);
  std::
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  ::
  tuple<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<libaom_test::TestMode,_libaom_test::TestMode>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int,_int>,_testing::internal::ValueArray<int>,_true,_true>
            (in_RDI,in_stack_ffffffffffffff58);
  CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>
  ::CartesianProductGenerator(in_RSI,g);
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  ::ParamGenerator((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                    *)in_RDI,
                   (ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                    *)in_stack_ffffffffffffff58);
  std::
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  ::~tuple((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
            *)0x559717);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)g;
  return (ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }